

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O2

string * __thiscall
branch_and_reduce_algorithm::debugString_abi_cxx11_
          (string *__return_storage_ptr__,branch_and_reduce_algorithm *this)

{
  tm *__tp;
  size_t sVar1;
  ostream *poVar2;
  int i;
  int iVar3;
  locale alStack_228 [8];
  time_t t;
  char mbstr [100];
  stringstream ins;
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ins);
  std::locale::locale((locale *)mbstr,"ja_JP.utf8");
  std::locale::global(alStack_228);
  std::locale::~locale(alStack_228);
  std::locale::~locale((locale *)mbstr);
  iVar3 = 0;
  t = time((time_t *)0x0);
  __tp = localtime(&t);
  sVar1 = strftime(mbstr,100,"%T",__tp);
  if (sVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,mbstr);
    std::operator<<(poVar2,'\n');
  }
  for (; (iVar3 < this->depth && (iVar3 < this->maxDepth)); iVar3 = iVar3 + 1) {
    std::operator<<(local_1a0," ");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ins);
  return __return_storage_ptr__;
}

Assistant:

std::string branch_and_reduce_algorithm::debugString() const
{
    stringstream ins;
#ifdef PUT_TIME
    time_t rawtime;
    struct tm *timeinfo;

    time(&rawtime);
    timeinfo = localtime(&rawtime);
    ins << std::put_time(timeinfo, "%T") << "  ";
#else
    std::locale::global(std::locale("ja_JP.utf8"));
    std::time_t t = std::time(NULL);
    char mbstr[100];
    if (std::strftime(mbstr, sizeof(mbstr), "%T", std::localtime(&t)))
    {
        std::cout << mbstr << '\n';
    }
#endif
    for (int i = 0; i < depth && i < maxDepth; ++i)
    {
        ins << " ";
    }
    return ins.str();
}